

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O2

DynamicStaleResourceWrapper __thiscall
Diligent::DynamicStaleResourceWrapper::Create<VulkanUtilities::VulkanMemoryAllocation,void>
          (DynamicStaleResourceWrapper *this,VulkanMemoryAllocation *Resource,
          RefCounterType NumReferences)

{
  _func_int **pp_Var1;
  StaleResourceBase *pSVar2;
  char (*in_RCX) [19];
  string msg;
  
  if (NumReferences < 1) {
    FormatString<char[26],char[19]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"NumReferences >= 1",
               in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/ResourceReleaseQueue.hpp"
               ,0x48);
    std::__cxx11::string::~string((string *)&msg);
  }
  else if (NumReferences == 1) {
    pSVar2 = (StaleResourceBase *)::operator_new(0x20);
    pSVar2->_vptr_StaleResourceBase = (_func_int **)&PTR__SpecificStaleResource_008917c0;
    pSVar2[1]._vptr_StaleResourceBase = (_func_int **)Resource->Page;
    pp_Var1 = (_func_int **)Resource->Size;
    pSVar2[2]._vptr_StaleResourceBase = (_func_int **)Resource->UnalignedOffset;
    pSVar2[3]._vptr_StaleResourceBase = pp_Var1;
    Resource->Page = (VulkanMemoryPage *)0x0;
    Resource->UnalignedOffset = 0;
    Resource->Size = 0;
    goto LAB_001aad20;
  }
  pSVar2 = (StaleResourceBase *)::operator_new(0x28);
  pSVar2->_vptr_StaleResourceBase = (_func_int **)&PTR__SpecificSharedStaleResource_00891800;
  pSVar2[1]._vptr_StaleResourceBase = (_func_int **)Resource->Page;
  pp_Var1 = (_func_int **)Resource->Size;
  pSVar2[2]._vptr_StaleResourceBase = (_func_int **)Resource->UnalignedOffset;
  pSVar2[3]._vptr_StaleResourceBase = pp_Var1;
  Resource->Page = (VulkanMemoryPage *)0x0;
  Resource->UnalignedOffset = 0;
  Resource->Size = 0;
  pSVar2[4]._vptr_StaleResourceBase = (_func_int **)NumReferences;
LAB_001aad20:
  this->m_pStaleResource = pSVar2;
  return (DynamicStaleResourceWrapper)(StaleResourceBase *)this;
}

Assistant:

static DynamicStaleResourceWrapper Create(ResourceType&& Resource, RefCounterType NumReferences)
    {
        VERIFY_EXPR(NumReferences >= 1);

        class SpecificStaleResource final : public StaleResourceBase
        {
        public:
            SpecificStaleResource(ResourceType&& SpecificResource) :
                m_SpecificResource(std::move(SpecificResource))
            {}

            // clang-format off
            SpecificStaleResource             (const SpecificStaleResource&) = delete;
            SpecificStaleResource             (SpecificStaleResource&&)      = delete;
            SpecificStaleResource& operator = (const SpecificStaleResource&) = delete;
            SpecificStaleResource& operator = (SpecificStaleResource&&)      = delete;
            // clang-format on

            virtual void Release() override final
            {
                delete this;
            }

        private:
            ResourceType m_SpecificResource;
        };

        class SpecificSharedStaleResource final : public StaleResourceBase
        {
        public:
            SpecificSharedStaleResource(ResourceType&& SpecificResource, RefCounterType NumReferences) :
                m_SpecificResource(std::move(SpecificResource)),
                m_RefCounter{NumReferences}
            {
            }

            // clang-format off
            SpecificSharedStaleResource             (const SpecificSharedStaleResource&) = delete;
            SpecificSharedStaleResource             (SpecificSharedStaleResource&&)      = delete;
            SpecificSharedStaleResource& operator = (const SpecificSharedStaleResource&) = delete;
            SpecificSharedStaleResource& operator = (SpecificSharedStaleResource&&)      = delete;
            // clang-format on

            virtual void Release() override final
            {
                if (m_RefCounter.fetch_add(-1) - 1 == 0)
                {
                    delete this;
                }
            }

        private:
            ResourceType                m_SpecificResource;
            std::atomic<RefCounterType> m_RefCounter;
        };

        return DynamicStaleResourceWrapper{
            NumReferences == 1 ?
                static_cast<StaleResourceBase*>(new SpecificStaleResource{std::move(Resource)}) :
                static_cast<StaleResourceBase*>(new SpecificSharedStaleResource{std::move(Resource), NumReferences})};
    }